

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usda-reader.cc
# Opt level: O3

bool tinyusdz::usda::anon_unknown_1::ToPrimSpecRec
               (size_t primSpecIdx,
               vector<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode>_>
               *primspec_nodes,PrimSpec *parent,string *err)

{
  pointer pPVar1;
  _Base_ptr p_Var2;
  size_t sVar3;
  _Link_type p_Var4;
  size_t *psVar5;
  size_t sVar6;
  bool bVar7;
  ulong uVar8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  _Link_type p_Var11;
  _Link_type p_Var12;
  _Link_type p_Var13;
  _Base_ptr p_Var14;
  size_t *psVar15;
  int64_t vidx;
  VariantSetSpec variantSet;
  set<long,_std::less<long>,_std::allocator<long>_> variantChildrenIndices;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
  variantSets;
  PrimSpec variant;
  PrimSpec primspec;
  PrimSpec variantChildPrim;
  size_t local_1168;
  undefined1 local_1160 [40];
  _Rb_tree_node_base local_1138;
  size_t local_1118;
  PrimSpec *local_1110;
  pointer local_1108;
  _Base_ptr local_1100;
  _Base_ptr local_10f8;
  _Base_ptr local_10f0;
  string local_10e8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_10c8;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::VariantSetSpec>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::VariantSetSpec>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::VariantSetSpec>>>
  local_1098 [8];
  undefined4 local_1090 [2];
  _Link_type local_1088;
  undefined4 *local_1080;
  undefined4 *local_1078;
  undefined8 local_1070;
  undefined1 local_1068 [96];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  local_1008 [216];
  PrimMetas local_f30;
  PrimSpec local_b00;
  size_type *local_598 [2];
  size_type local_588 [171];
  
  pPVar1 = (primspec_nodes->
           super__Vector_base<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar8 = ((long)(primspec_nodes->
                 super__Vector_base<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1 >> 3) *
          0x6fe99e1395aedd07;
  if (uVar8 < primSpecIdx || uVar8 - primSpecIdx == 0) {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
    bVar7 = false;
  }
  else {
    local_1108 = pPVar1 + primSpecIdx;
    local_1110 = parent;
    PrimSpec::PrimSpec(&local_b00,&local_1108->primSpec);
    local_10c8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_10c8._M_impl.super__Rb_tree_header._M_header;
    local_10c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_10c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_10c8._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1080 = local_1090;
    local_1090[0] = 0;
    local_1088 = (_Link_type)0x0;
    local_1070 = 0;
    local_1100 = (_Base_ptr)((long)&pPVar1[primSpecIdx].variantNodeMap._M_t._M_impl + 8);
    p_Var10 = *(_Base_ptr *)((long)&pPVar1[primSpecIdx].variantNodeMap._M_t._M_impl + 0x18);
    local_10c8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_10c8._M_impl.super__Rb_tree_header._M_header._M_left;
    local_1078 = local_1080;
    if (p_Var10 != local_1100) {
      do {
        local_1160._0_8_ = local_1160 + 0x10;
        p_Var14 = p_Var10 + 1;
        local_1160._8_8_ = 0;
        local_1160[0x10] = '\0';
        local_1138._M_color = _S_red;
        local_1138._M_parent = (_Base_ptr)0x0;
        local_1138._M_left = &local_1138;
        local_1118 = 0;
        p_Var9 = p_Var10[2]._M_right;
        local_10f0 = (_Base_ptr)&p_Var10[2]._M_parent;
        local_1138._M_right = local_1138._M_left;
        p_Var2 = p_Var14;
        if (p_Var9 != local_10f0) {
          do {
            local_10f8 = p_Var2;
            PrimSpec::PrimSpec((PrimSpec *)local_1068);
            p_Var2 = p_Var9[0x23]._M_left;
            for (p_Var14 = p_Var9[0x23]._M_parent; p_Var14 != p_Var2;
                p_Var14 = (_Base_ptr)&p_Var14->_M_parent) {
              local_1168 = *(size_t *)p_Var14;
              if ((_Link_type)local_10c8._M_impl.super__Rb_tree_header._M_header._M_parent !=
                  (_Link_type)0x0) {
                p_Var4 = (_Link_type)local_10c8._M_impl.super__Rb_tree_header._M_header._M_parent;
                p_Var13 = (_Link_type)&local_10c8._M_impl.super__Rb_tree_header;
                do {
                  p_Var12 = p_Var13;
                  p_Var11 = p_Var4;
                  sVar3 = *(size_t *)(p_Var11->_M_storage)._M_storage;
                  p_Var13 = p_Var11;
                  if ((long)sVar3 < (long)local_1168) {
                    p_Var13 = p_Var12;
                  }
                  p_Var4 = *(_Link_type *)
                            (&p_Var11->_M_storage)[(ulong)((long)sVar3 < (long)local_1168) - 2].
                            _M_storage;
                } while (p_Var4 != (_Link_type)0x0);
                if ((_Rb_tree_header *)p_Var13 == &local_10c8._M_impl.super__Rb_tree_header)
                goto LAB_00137e49;
                if ((long)sVar3 < (long)local_1168) {
                  p_Var11 = p_Var12;
                }
                if ((long)local_1168 < (long)*(size_t *)(p_Var11->_M_storage)._M_storage)
                goto LAB_00137e49;
                if (err != (string *)0x0) {
                  local_10e8._M_dataplus._M_p = (pointer)&local_10e8.field_2;
                  ::std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_10e8,
                             "variant primIdx {} is referenced multiple times.\n","");
                  fmt::format<long>((string *)local_598,&local_10e8,(long *)&local_1168);
                  ::std::__cxx11::string::operator=((string *)err,(string *)local_598);
                  if (local_598[0] != local_588) {
                    operator_delete(local_598[0],local_588[0] + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_10e8._M_dataplus._M_p != &local_10e8.field_2) {
                    operator_delete(local_10e8._M_dataplus._M_p,
                                    local_10e8.field_2._M_allocated_capacity + 1);
                  }
                }
LAB_00137fae:
                PrimSpec::~PrimSpec((PrimSpec *)local_1068);
                bVar7 = false;
                goto LAB_00137fb9;
              }
LAB_00137e49:
              if (((long)local_1168 < 0) ||
                 ((ulong)(((long)(primspec_nodes->
                                 super__Vector_base<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                           (long)(primspec_nodes->
                                 super__Vector_base<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode>_>
                                 )._M_impl.super__Vector_impl_data._M_start >> 3) *
                         0x6fe99e1395aedd07) < local_1168)) {
                if (err != (string *)0x0) {
                  ::std::__cxx11::string::_M_replace
                            ((ulong)err,0,(char *)err->_M_string_length,0x3d283d);
                }
                goto LAB_00137fae;
              }
              PrimSpec::PrimSpec((PrimSpec *)local_598);
              bVar7 = ToPrimSpecRec(local_1168,primspec_nodes,(PrimSpec *)local_598,err);
              if (!bVar7) {
                PrimSpec::~PrimSpec((PrimSpec *)local_598);
                goto LAB_00137fae;
              }
              ::std::vector<tinyusdz::PrimSpec,std::allocator<tinyusdz::PrimSpec>>::
              emplace_back<tinyusdz::PrimSpec&>
                        ((vector<tinyusdz::PrimSpec,std::allocator<tinyusdz::PrimSpec>> *)
                         (local_1068 + 0x48),(PrimSpec *)local_598);
              PrimSpec::~PrimSpec((PrimSpec *)local_598);
              ::std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
              _M_insert_unique<long_const&>
                        ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>
                          *)&local_10c8,(long *)&local_1168);
            }
            PrimMetas::operator=(&local_f30,(PrimMetas *)(p_Var9 + 2));
            ::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
            ::operator=(local_1008,
                        (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                         *)&p_Var9[0x21]._M_right);
            p_Var14 = local_10f8;
            ::std::__cxx11::string::_M_assign((string *)local_1160);
            ::std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec>>>
            ::_M_emplace_unique<std::__cxx11::string_const&,tinyusdz::PrimSpec>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec>>>
                        *)(local_1160 + 0x20),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var9 + 1),(PrimSpec *)local_1068);
            PrimSpec::~PrimSpec((PrimSpec *)local_1068);
            p_Var9 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var9);
            p_Var2 = local_10f8;
          } while (p_Var9 != local_10f0);
        }
        ::std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::VariantSetSpec>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::VariantSetSpec>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::VariantSetSpec>>>
        ::_M_emplace_unique<std::__cxx11::string_const&,tinyusdz::VariantSetSpec>
                  (local_1098,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var14,
                   (VariantSetSpec *)local_1160);
        bVar7 = true;
LAB_00137fb9:
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
        ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::PrimSpec>_>_>
                    *)(local_1160 + 0x20),(_Link_type)local_1138._M_parent);
        if ((undefined1 *)local_1160._0_8_ != local_1160 + 0x10) {
          operator_delete((void *)local_1160._0_8_,CONCAT71(local_1160._17_7_,local_1160[0x10]) + 1)
          ;
        }
        if (!bVar7) {
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
          ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
                      *)local_1098,local_1088);
          goto LAB_001381fc;
        }
        p_Var10 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var10);
      } while (p_Var10 != local_1100);
    }
    ::std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
    ::operator=(&local_b00._variantSets,
                (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
                 *)local_1098);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
    ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
                *)local_1098,local_1088);
    psVar15 = *(size_t **)
               &(local_1108->children).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
    psVar5 = *(pointer *)
              ((long)&(local_1108->children).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + 8);
    if (psVar15 != psVar5) {
      do {
        if ((_Link_type)local_10c8._M_impl.super__Rb_tree_header._M_header._M_parent ==
            (_Link_type)0x0) {
LAB_0013817c:
          PrimSpec::PrimSpec((PrimSpec *)local_1068);
          bVar7 = ToPrimSpecRec(*psVar15,primspec_nodes,(PrimSpec *)local_1068,err);
          if (bVar7) {
            ::std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::
            emplace_back<tinyusdz::PrimSpec>(&local_b00._children,(PrimSpec *)local_1068);
            PrimSpec::~PrimSpec((PrimSpec *)local_1068);
            goto LAB_001381ac;
          }
          PrimSpec::~PrimSpec((PrimSpec *)local_1068);
LAB_001381fc:
          bVar7 = false;
          goto LAB_001381fe;
        }
        sVar3 = *psVar15;
        p_Var4 = (_Link_type)local_10c8._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var13 = (_Link_type)&local_10c8._M_impl.super__Rb_tree_header;
        do {
          p_Var12 = p_Var13;
          p_Var11 = p_Var4;
          sVar6 = *(size_t *)(p_Var11->_M_storage)._M_storage;
          p_Var13 = p_Var11;
          if ((long)sVar6 < (long)sVar3) {
            p_Var13 = p_Var12;
          }
          p_Var4 = *(_Link_type *)
                    (&p_Var11->_M_storage)[(ulong)((long)sVar6 < (long)sVar3) - 2]._M_storage;
        } while (p_Var4 != (_Link_type)0x0);
        if ((_Rb_tree_header *)p_Var13 == &local_10c8._M_impl.super__Rb_tree_header)
        goto LAB_0013817c;
        if ((long)sVar6 < (long)sVar3) {
          p_Var11 = p_Var12;
        }
        if ((long)sVar3 < (long)*(size_t *)(p_Var11->_M_storage)._M_storage) goto LAB_0013817c;
LAB_001381ac:
        psVar15 = psVar15 + 1;
      } while (psVar15 != psVar5);
    }
    bVar7 = true;
    if (&local_b00 != local_1110) {
      PrimSpec::MoveFrom(local_1110,&local_b00);
    }
LAB_001381fe:
    ::std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
    _M_erase(&local_10c8,(_Link_type)local_10c8._M_impl.super__Rb_tree_header._M_header._M_parent);
    PrimSpec::~PrimSpec(&local_b00);
  }
  return bVar7;
}

Assistant:

bool ToPrimSpecRec(const size_t primSpecIdx,
                        std::vector<PrimSpecNode> &primspec_nodes, PrimSpec &parent, std::string *err) {

  if (primSpecIdx >= primspec_nodes.size()) {
    if (err) {
      (*err) += "Internal error; primSpecIdx exceeds primspec_nodes.size.";
    }
    return false;
  }

  const PrimSpecNode &node = primspec_nodes[primSpecIdx];

  PrimSpec primspec = node.primSpec;

  // Firstly process variants.
  std::set<int64_t> variantChildrenIndices; // record variantChildren indices
  {

    std::map<std::string, VariantSetSpec> variantSets;
    for (const auto &variantNodes : node.variantNodeMap) {
      DCOUT("variantSet " << variantNodes.first);
      VariantSetSpec variantSet;
      for (const auto &item : variantNodes.second) {
        DCOUT("variant " << item.first);
        PrimSpec variant; // variantNode can be represented as PrimSpec.
        for (const int64_t vidx : item.second.primChildren) {
          if (variantChildrenIndices.count(vidx)) {
            // Duplicated variant childrenIndices
            if (err) {
              (*err) = fmt::format("variant primIdx {} is referenced multiple times.\n", vidx);
            }
            return false;
          } else {
            // Add prim to variants
            if ((vidx >= 0) && (size_t(vidx) <= primspec_nodes.size())) {

              PrimSpec variantChildPrim; // dummy
              if (!ToPrimSpecRec(size_t(vidx), primspec_nodes, variantChildPrim, err)) {
                return false;
              }

              DCOUT(fmt::format("Added prim {} to variantSet {} : variant {}", variantChildPrim.name(), variantNodes.first, item.first));
              variant.children().emplace_back(variantChildPrim);
            } else {
              if (err) {
                (*err) = "primIndex exceeds prim_nodes.size()\n";
              }
              return false;
            }

            variantChildrenIndices.insert(vidx);
          }
        }

        variant.metas() = std::move(item.second.metas);
        variant.props() = std::move(item.second.props);

        variantSet.name = variantNodes.first;
        variantSet.variantSet.emplace(item.first, std::move(variant));
      }
      DCOUT(fmt::format("Add {} to variantSet", variantNodes.first));
      variantSets.emplace(variantNodes.first, std::move(variantSet));
    }
    primspec.variantSets() = std::move(variantSets);
  }

  for (const auto &cidx : node.children) {

    if (variantChildrenIndices.count(int64_t(cidx))) {
      // PrimSpec is already processed
      continue;
    }

    PrimSpec childPrimSpec;
    if (!ToPrimSpecRec(cidx, primspec_nodes, childPrimSpec, err)) {
      return false;
    }
    primspec.children().emplace_back(std::move(childPrimSpec));
  }

  parent = std::move(primspec);

  return true;
}